

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O0

CURLcode Curl_convert_clone(Curl_easy *data,char *indata,size_t insize,char **outbuf)

{
  char *__dest;
  char *convbuf;
  char **outbuf_local;
  size_t insize_local;
  char *indata_local;
  Curl_easy *data_local;
  
  __dest = (char *)(*Curl_cmalloc)(insize);
  if (__dest == (char *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    memcpy(__dest,indata,insize);
    *outbuf = __dest;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_convert_clone(struct Curl_easy *data,
                            const char *indata,
                            size_t insize,
                            char **outbuf)
{
  char *convbuf;
  (void)data;

  convbuf = malloc(insize);
  if(!convbuf)
    return CURLE_OUT_OF_MEMORY;

  memcpy(convbuf, indata, insize);
  *outbuf = convbuf;
  return CURLE_OK;
}